

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_enlarge_visible(REF_CAVITY ref_cavity)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL manifold;
  REF_BOOL keep_growing;
  REF_BOOL visible;
  REF_INT face;
  REF_INT node;
  REF_NODE ref_node;
  REF_CAVITY ref_cavity_local;
  
  _face = ref_cavity->ref_grid->node;
  visible = ref_cavity->node;
  ref_node = (REF_NODE)ref_cavity;
  if (_face->ref_mpi->id == _face->part[visible]) {
    if (ref_cavity->debug != 0) {
      printf(" enlarge start %d tets %d faces\n",(ulong)(uint)ref_cavity->tet_list->n,
             (ulong)(uint)ref_cavity->nface);
    }
    if (ref_node->n == 0) {
      uVar1 = ref_cavity_verify_face_manifold((REF_CAVITY)ref_node);
      if (uVar1 == 0) {
        ref_private_macro_code_rss = 1;
        while (ref_private_macro_code_rss != 0) {
          ref_private_macro_code_rss = 0;
          for (keep_growing = 0; keep_growing < *(int *)((long)&ref_node->age + 4);
              keep_growing = keep_growing + 1) {
            if (((((-1 < keep_growing) && (keep_growing < *(int *)((long)&ref_node->age + 4))) &&
                 (*(int *)(*(long *)&ref_node->naux + (long)(keep_growing * 3) * 4) != -1)) &&
                ((visible != *(int *)(*(long *)&ref_node->naux + (long)(keep_growing * 3) * 4) &&
                 (visible != *(int *)(*(long *)&ref_node->naux + (long)(keep_growing * 3 + 1) * 4)))
                )) && (visible !=
                       *(int *)(*(long *)&ref_node->naux + (long)(keep_growing * 3 + 2) * 4))) {
              uVar1 = ref_cavity_visible((REF_CAVITY)ref_node,keep_growing,&manifold);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x78b,"ref_cavity_enlarge_visible",(ulong)uVar1,"free");
                return uVar1;
              }
              if (manifold == 0) {
                uVar1 = ref_cavity_enlarge_face((REF_CAVITY)ref_node,keep_growing);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x78d,"ref_cavity_enlarge_visible",(ulong)uVar1,"enlarge face");
                  return uVar1;
                }
                if (ref_node->n != 0) {
                  if ((*(int *)((long)&ref_node->new_n_global + 4) != 0) &&
                     (uVar1 = ref_cavity_tec((REF_CAVITY)ref_node,"enlarge.tec"), uVar1 != 0)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x791,"ref_cavity_enlarge_visible",(ulong)uVar1,
                           "tec for enlarge_face fail");
                    return uVar1;
                  }
                  return 0;
                }
                ref_private_macro_code_rss = 1;
              }
            }
          }
        }
        if (*(int *)((long)&ref_node->new_n_global + 4) != 0) {
          printf(" enlarge final %d tets %d faces\n",(ulong)(uint)ref_node->ref_mpi->n,
                 (ulong)*(uint *)&ref_node->age);
        }
        uVar1 = ref_cavity_manifold((REF_CAVITY)ref_node,&ref_private_macro_code_rss_1);
        if (uVar1 == 0) {
          if (ref_private_macro_code_rss_1 == 0) {
            if (*(int *)((long)&ref_node->new_n_global + 4) != 0) {
              printf(" visible not manifold\n");
            }
            ref_node->n = 4;
            ref_cavity_local._4_4_ = 0;
          }
          else {
            ref_node->n = 1;
            ref_cavity_local._4_4_ = ref_cavity_verify_face_manifold((REF_CAVITY)ref_node);
            if (ref_cavity_local._4_4_ == 0) {
              ref_cavity_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x7a8,"ref_cavity_enlarge_visible",(ulong)ref_cavity_local._4_4_,
                     "final manifold check");
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x79f,"ref_cavity_enlarge_visible",(ulong)uVar1,"manifold");
          ref_cavity_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x77f,"ref_cavity_enlarge_visible",(ulong)uVar1,"initial manifold check");
        ref_cavity_local._4_4_ = uVar1;
      }
    }
    else {
      ref_cavity_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x776,
           "ref_cavity_enlarge_visible","cavity part must own node");
    ref_cavity_local._4_4_ = 1;
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_enlarge_visible(REF_CAVITY ref_cavity) {
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_INT face;
  REF_BOOL visible;
  REF_BOOL keep_growing;
  REF_BOOL manifold;

  RAS(ref_node_owned(ref_node, node), "cavity part must own node");

  if (ref_cavity_debug(ref_cavity))
    printf(" enlarge start %d tets %d faces\n",
           ref_list_n(ref_cavity_tet_list(ref_cavity)),
           ref_cavity_nface(ref_cavity));

  if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "initial manifold check");

  keep_growing = REF_TRUE;
  while (keep_growing) {
    keep_growing = REF_FALSE;
    each_ref_cavity_valid_face(ref_cavity, face) {
      /* skip a face attached to node */
      if (node == ref_cavity_f2n(ref_cavity, 0, face) ||
          node == ref_cavity_f2n(ref_cavity, 1, face) ||
          node == ref_cavity_f2n(ref_cavity, 2, face))
        continue;

      RSS(ref_cavity_visible(ref_cavity, face, &visible), "free");
      if (!visible) {
        RSS(ref_cavity_enlarge_face(ref_cavity, face), "enlarge face");
        if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) {
          if (ref_cavity_debug(ref_cavity)) {
            RSS(ref_cavity_tec(ref_cavity, "enlarge.tec"),
                "tec for enlarge_face fail");
          }
          return REF_SUCCESS;
        }
        keep_growing = REF_TRUE;
      }
    }
  }

  if (ref_cavity_debug(ref_cavity))
    printf(" enlarge final %d tets %d faces\n",
           ref_list_n(ref_cavity_tet_list(ref_cavity)),
           ref_cavity_nface(ref_cavity));

  RSS(ref_cavity_manifold(ref_cavity, &manifold), "manifold");
  if (!manifold) {
    if (ref_cavity_debug(ref_cavity)) printf(" visible not manifold\n");
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cavity_state(ref_cavity) = REF_CAVITY_VISIBLE;

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "final manifold check");

  return REF_SUCCESS;
}